

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * kname(Proto *p,int index,char **name)

{
  TValue *pTVar1;
  code *local_38;
  TValue *kvalue;
  char **name_local;
  int index_local;
  Proto *p_local;
  
  pTVar1 = p->k + index;
  if ((pTVar1->tt_ & 0xf) == 4) {
    if ((char)(pTVar1->value_).f[0xb] < '\0') {
      local_38 = *(code **)((pTVar1->value_).f + 0x18);
    }
    else {
      local_38 = (pTVar1->value_).f + 0x18;
    }
    *name = (char *)local_38;
    p_local = (Proto *)anon_var_dwarf_60dd;
  }
  else {
    *name = "?";
    p_local = (Proto *)0x0;
  }
  return (char *)p_local;
}

Assistant:

static const char *kname (const Proto *p, int index, const char **name) {
  TValue *kvalue = &p->k[index];
  if (ttisstring(kvalue)) {
    *name = getstr(tsvalue(kvalue));
    return "constant";
  }
  else {
    *name = "?";
    return NULL;
  }
}